

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::MethodPrototypeSymbol::serializeTo
          (MethodPrototypeSymbol *this,ASTSerializer *serializer)

{
  ushort uVar1;
  pointer ppFVar2;
  size_t sVar3;
  Type *__n;
  SubroutineSymbol *__n_00;
  bitmask<slang::ast::MethodFlags> flags;
  long lVar4;
  string_view sVar5;
  string sStack_48;
  
  __n = DeclaredType::getType(&this->declaredReturnType);
  ASTSerializer::write(serializer,10,"returnType",(size_t)__n);
  sVar5 = ast::toString(this->subroutineKind);
  ASTSerializer::write(serializer,0xe,"subroutineKind",sVar5._M_len);
  sVar5 = ast::toString(this->visibility);
  ASTSerializer::write(serializer,10,"visibility",sVar5._M_len);
  sVar5._M_str = "arguments";
  sVar5._M_len = 9;
  ASTSerializer::startArray(serializer,sVar5);
  ppFVar2 = (this->arguments)._M_ptr;
  sVar3 = (this->arguments)._M_extent._M_extent_value;
  for (lVar4 = 0; sVar3 << 3 != lVar4; lVar4 = lVar4 + 8) {
    ASTSerializer::serialize(serializer,*(Symbol **)((long)ppFVar2 + lVar4),false);
  }
  ASTSerializer::endArray(serializer);
  uVar1 = (this->flags).m_bits;
  if (uVar1 != 0) {
    flagsToStr_abi_cxx11_(&sStack_48,(ast *)(ulong)uVar1,flags);
    ASTSerializer::write(serializer,5,"flags",(size_t)&sStack_48);
    std::__cxx11::string::~string((string *)&sStack_48);
  }
  __n_00 = getSubroutine(this);
  if (__n_00 != (SubroutineSymbol *)0x0) {
    ASTSerializer::write(serializer,10,"subroutine",(size_t)__n_00);
  }
  return;
}

Assistant:

void MethodPrototypeSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("returnType", getReturnType());
    serializer.write("subroutineKind", toString(subroutineKind));
    serializer.write("visibility", toString(visibility));

    serializer.startArray("arguments");
    for (auto arg : arguments)
        serializer.serialize(*arg);
    serializer.endArray();

    if (flags)
        serializer.write("flags", flagsToStr(flags));

    if (auto* sub = getSubroutine())
        serializer.write("subroutine", *sub);
}